

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_1::FillRuleCase::FillRuleCase
          (FillRuleCase *this,Context *ctx,char *name,char *desc,FillRuleCaseType type)

{
  int iVar1;
  int renderSize;
  bool bVar2;
  
  (this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_0071c5f8;
  bVar2 = ((FillRuleCaseType)desc & ~FILLRULECASE_REVERSED) == FILLRULECASE_CLIPPED_FULL;
  renderSize = 0x100;
  if (bVar2) {
    renderSize = 0x40;
  }
  iVar1 = 2;
  if (bVar2) {
    iVar1 = 0xf;
  }
  BaseRenderingCase::BaseRenderingCase
            (&this->super_BaseRenderingCase,ctx,name,"Verify fill rules",renderSize);
  (this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_0071c5f8;
  this->m_caseType = (FillRuleCaseType)desc;
  this->m_iteration = 0;
  this->m_iterationCount = iVar1;
  this->m_allIterationsPassed = true;
  return;
}

Assistant:

FillRuleCase::FillRuleCase (Context& ctx, const char* name, const char* desc, FillRuleCaseType type)
	: BaseRenderingCase		(ctx, name, desc, getRenderSize(type))
	, m_caseType			(type)
	, m_iteration			(0)
	, m_iterationCount		(getNumIterations(type))
	, m_allIterationsPassed	(true)
{
	DE_ASSERT(type < FILLRULECASE_LAST);
}